

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::iterator::insert
          (iterator *this,unsigned_long left,unsigned_long right,monostate *value,
          allocator_type *alloc)

{
  Path *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  IntervalMap<unsigned_long,_std::monostate,_0U> *this_01;
  void *pvVar3;
  long lVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  uintptr_t intWord;
  IndexPair offset;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint32_t position;
  pointer pEVar11;
  size_type sVar12;
  uint uVar13;
  ulong uVar14;
  unsigned_long uVar15;
  
  this_01 = (this->super_const_iterator).map;
  this_00 = &(this->super_const_iterator).path;
  if (this_01->height == 0) {
    pEVar11 = (this->super_const_iterator).path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    uVar13 = pEVar11[(this->super_const_iterator).path.path.
                     super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].offset;
    position = 0xb;
    if ((ulong)uVar13 != 0xb) {
      uVar6 = this_01->rootSize;
      if (uVar13 != uVar6) {
        position = uVar13;
        uVar10 = uVar6;
        if (uVar6 == 0xb) goto LAB_00431a54;
        do {
          uVar7 = uVar10 - 1;
          puVar1 = (undefined8 *)((long)&this_01->field_0 + (ulong)uVar7 * 0x10);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&this_01->field_0 + (ulong)uVar10 * 0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          uVar10 = uVar7;
        } while (uVar13 != uVar7);
        pEVar11 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                  data_;
      }
      lVar9 = (ulong)uVar13 * 0x10;
      *(unsigned_long *)((long)&this_01->field_0 + lVar9) = left;
      *(unsigned_long *)((long)&this_01->field_0 + lVar9 + 8) = right;
      uVar6 = uVar6 + 1;
      if (uVar6 < 0xc) {
        this_01->rootSize = uVar6;
        pEVar11->size = uVar6;
        return;
      }
      position = pEVar11[(this->super_const_iterator).path.path.
                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                 offset;
    }
LAB_00431a54:
    offset = IntervalMap<unsigned_long,std::monostate,0u>::
             modifyRoot<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,true>,slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>,true>
                       ((IntervalMap<unsigned_long,std::monostate,0u> *)this_01,
                        (LeafNode<unsigned_long,_std::monostate,_11U,_true> *)this_01,position,alloc
                       );
    IntervalMapDetails::Path::
    replaceRoot<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>>
              (this_00,(BranchNode<unsigned_long,_8U,_true> *)this_01,this_01->rootSize,offset);
  }
  sVar12 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if ((sVar12 == 0) ||
     (pEVar11 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar11->size <= pEVar11->offset)) {
    IntervalMapDetails::Path::legalizeForInsert(this_00,((this->super_const_iterator).map)->height);
    pEVar11 = (this->super_const_iterator).path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    sVar12 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  }
  uVar13 = pEVar11[sVar12 - 1].offset;
  if ((ulong)uVar13 != 0xb) {
    uVar6 = pEVar11[sVar12 - 1].size;
    pvVar3 = pEVar11[sVar12 - 1].node;
    if (uVar13 != uVar6) {
      uVar10 = uVar6;
      if (uVar6 == 0xb) goto LAB_00431b06;
      do {
        uVar7 = uVar10 - 1;
        puVar1 = (undefined8 *)((long)pvVar3 + (ulong)uVar7 * 0x10);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pvVar3 + (ulong)uVar10 * 0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        uVar10 = uVar7;
      } while (uVar13 != uVar7);
    }
    lVar9 = (ulong)uVar13 * 0x10;
    *(unsigned_long *)((long)pvVar3 + lVar9) = left;
    *(unsigned_long *)((long)pvVar3 + lVar9 + 8) = right;
    uVar6 = uVar6 + 1;
    sVar12 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
    if (uVar6 < 0xc) goto LAB_00431b80;
  }
LAB_00431b06:
  IntervalMap<unsigned_long,std::monostate,0u>::iterator::
  overflow<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
            ((iterator *)this,(int)sVar12 - 1,alloc);
  pEVar11 = (this->super_const_iterator).path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  sVar12 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  uVar13 = pEVar11[sVar12 - 1].offset;
  uVar6 = 0xc;
  if ((ulong)uVar13 != 0xb) {
    pvVar3 = pEVar11[sVar12 - 1].node;
    uVar10 = pEVar11[sVar12 - 1].size;
    if (uVar13 != uVar10) {
      uVar7 = uVar10;
      if (uVar10 == 0xb) goto LAB_00431b80;
      do {
        uVar6 = uVar7 - 1;
        puVar1 = (undefined8 *)((long)pvVar3 + (ulong)uVar6 * 0x10);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pvVar3 + (ulong)uVar7 * 0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        uVar7 = uVar6;
      } while (uVar13 != uVar6);
    }
    lVar9 = (ulong)uVar13 * 0x10;
    *(unsigned_long *)((long)pvVar3 + lVar9) = left;
    *(unsigned_long *)((long)pvVar3 + lVar9 + 8) = right;
    uVar6 = uVar10 + 1;
    sVar12 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  }
LAB_00431b80:
  uVar13 = (int)sVar12 - 1;
  pEVar11 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  lVar9 = (ulong)uVar13 * 0x10;
  pEVar11[uVar13].size = uVar6;
  if (uVar13 != 0) {
    uVar13 = (int)sVar12 - 2;
    *(ulong *)((long)pEVar11[uVar13].node + (ulong)pEVar11[uVar13].offset * 8) =
         *(ulong *)((long)pEVar11[uVar13].node + (ulong)pEVar11[uVar13].offset * 8) &
         0xffffffffffffffc0 | (ulong)(uVar6 - 1);
    do {
      lVar4 = *(long *)((long)&pEVar11[-1].node + lVar9);
      lVar8 = (ulong)*(uint *)((long)pEVar11 + lVar9 + -4) * 0x10;
      uVar14 = *(ulong *)(lVar4 + 0x40 + lVar8);
      uVar15 = left;
      if (uVar14 <= left) {
        uVar15 = uVar14;
      }
      uVar14 = *(ulong *)(lVar4 + 0x48 + lVar8);
      *(unsigned_long *)(lVar4 + 0x40 + lVar8) = uVar15;
      if (uVar14 <= right) {
        uVar14 = right;
      }
      *(ulong *)(lVar4 + 0x48 + lVar8) = uVar14;
      lVar9 = lVar9 + -0x10;
    } while (lVar9 != 0);
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::insert(TKey left, TKey right, const TValue& value,
                                                    allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;

    interval<TKey> ival{left, right};
    if (this->isFlat()) {
        // Try simple root leaf insert first.
        uint32_t size = map.rootLeaf.insertFrom(path.leafOffset(), map.rootSize, ival, value);
        if (size <= RootLeaf::Capacity) {
            map.rootSize = size;
            path.setSize(0, size);
            return;
        }

        // Root is full, we need to branch.
        auto offset = map.switchToBranch(path.leafOffset(), alloc);
        path.replaceRoot(&map.rootBranch, map.rootSize, offset);
    }

    if (!path.valid())
        path.legalizeForInsert(this->map->height);

    uint32_t size = path.leafSize();
    size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), size, ival, value);

    if (size > Leaf::Capacity) {
        // If the new element didn't fit, overflow the node and try again.
        overflow<Leaf>(path.height(), alloc);
        size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), path.leafSize(), ival,
                                                     value);
    }

    // Update path to match the newly inserted element.
    path.setSize(path.height(), size);
    updateParentBounds(path.height(), ival);
}